

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccipher.t.c
# Opt level: O0

void test_cipher_caesar_with_data(void)

{
  FILE *pFVar1;
  cipher_data data2;
  char result2 [20];
  cipher_data data;
  char key [8];
  char result [20];
  char text [20];
  text_scorer scorer;
  
  pFVar1 = fopen("./english_quadgrams.txt","r");
  scorer_load_data(&stack0xffffffffffe41bb8,pFVar1);
  data.ct = &data.success;
  data.key._0_1_ = 1;
  data._16_8_ = &stack0xffffffffffe41bb8;
  data.scorer = (text_scorer *)key;
  data.result._0_1_ = 0;
  caesar_with_data(result2 + 0x10);
  UnityAssertEqualNumber(1,(ulong)((byte)data.result & 1),(char *)0x0,0xa9,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualString("19",data.ct,(char *)0x0,0xaa);
  UnityAssertEqualString("THISISACAESARCIPHER",(char *)data.scorer,(char *)0x0,0xab);
  data2.ct = "19";
  data2.key._0_1_ = 0;
  data2._16_8_ = &stack0xffffffffffe41bb8;
  data2.scorer = (text_scorer *)&data2.success;
  data2.result._0_1_ = 0;
  caesar_with_data(&stack0xffffffffffe41af8);
  UnityAssertEqualNumber(1,(ulong)((byte)data2.result & 1),(char *)0x0,0xbb,UNITY_DISPLAY_STYLE_INT)
  ;
  UnityAssertEqualString("THISISACAESARCIPHER",(char *)data2.scorer,(char *)0x0,0xbc);
  return;
}

Assistant:

void test_cipher_caesar_with_data(void)
{
	// Load the quadgram data
	struct text_scorer scorer;
	scorer_load_data(&scorer, fopen("./english_quadgrams.txt", "r"));

	// Test autocrack

	char text[] = "AOPZPZHJHLZHYJPWOLY";
	char result[sizeof(text)];
	char key[8];

	struct cipher_data data = {
			.ct = text,
			.key = key,
			.use_autocrack = true,
			.scorer = &scorer,
			.result = result,
	};

	caesar_with_data(&data);

	TEST_ASSERT_EQUAL_INT(true, data.success);
	TEST_ASSERT_EQUAL_STRING("19", data.key);
	TEST_ASSERT_EQUAL_STRING("THISISACAESARCIPHER", data.result);

	// Test solve with key

	char result2[sizeof(text)];

	struct cipher_data data2 = {
			.ct = text,
			.key = "19",
			.use_autocrack = false,
			.scorer = &scorer,
			.result = result2,
	};

	caesar_with_data(&data2);

	TEST_ASSERT_EQUAL_INT(true, data2.success);
	TEST_ASSERT_EQUAL_STRING("THISISACAESARCIPHER", data2.result);
}